

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O3

void __thiscall
QPlainTextEditSearchWidget::QPlainTextEditSearchWidget
          (QPlainTextEditSearchWidget *this,QPlainTextEdit *parent)

{
  void **ppvVar1;
  void *pvVar2;
  undefined4 *puVar3;
  code *local_a0;
  ImplFn local_98;
  QArrayData *local_90;
  char16_t *local_88;
  undefined8 local_80;
  QTimer *local_78;
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  QWidget::QWidget((QWidget *)this,parent,0);
  *(undefined ***)this = &PTR_metaObject_0015e920;
  *(undefined ***)(this + 0x10) = &PTR__QPlainTextEditSearchWidget_0015ead0;
  pvVar2 = operator_new(0x90);
  *(void **)(this + 0x28) = pvVar2;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined4 *)(this + 0x50) = 1;
  *(undefined8 *)(this + 0x54) = 0xb4b400006464;
  *(undefined2 *)(this + 0x5c) = 0;
  local_78 = (QTimer *)(this + 0x60);
  QTimer::QTimer(local_78,(QObject *)0x0);
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  Ui_QPlainTextEditSearchWidget::setupUi
            (*(Ui_QPlainTextEditSearchWidget **)(this + 0x28),(QWidget *)this);
  *(QPlainTextEdit **)(this + 0x88) = parent;
  this[0x90] = (QPlainTextEditSearchWidget)0x0;
  QWidget::hide();
  local_90 = (QArrayData *)0x0;
  local_88 = L"* {color: grey}";
  local_80 = 0xf;
  QWidget::setStyleSheet(*(QString **)(*(long *)(this + 0x28) + 0x18));
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,8);
    }
  }
  QWidget::setEnabled(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x18),0));
  *(undefined8 *)(this + 0x30) = 0;
  ppvVar1 = *(void ***)(*(long *)(this + 0x28) + 0x38);
  local_90 = (QArrayData *)QAbstractButton::clicked;
  local_88 = (char16_t *)0x0;
  local_a0 = deactivate;
  local_98 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QPlainTextEditSearchWidget::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = deactivate;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_38,ppvVar1,(QObject *)&local_90,(void **)this,(QSlotObjectBase *)&local_a0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  ppvVar1 = *(void ***)(*(long *)(this + 0x28) + 8);
  local_90 = (QArrayData *)QLineEdit::textChanged;
  local_88 = (char16_t *)0x0;
  local_a0 = searchLineEditTextChanged;
  local_98 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QSlotObject<void_(QPlainTextEditSearchWidget::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = searchLineEditTextChanged;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_40,ppvVar1,(QObject *)&local_90,(void **)this,(QSlotObjectBase *)&local_a0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  ppvVar1 = *(void ***)(*(long *)(this + 0x28) + 0x48);
  local_90 = (QArrayData *)QAbstractButton::clicked;
  local_88 = (char16_t *)0x0;
  local_a0 = doSearchDown;
  local_98 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QPlainTextEditSearchWidget::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = doSearchDown;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_48,ppvVar1,(QObject *)&local_90,(void **)this,(QSlotObjectBase *)&local_a0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  ppvVar1 = *(void ***)(*(long *)(this + 0x28) + 0x28);
  local_90 = (QArrayData *)QAbstractButton::clicked;
  local_88 = (char16_t *)0x0;
  local_a0 = doSearchUp;
  local_98 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QPlainTextEditSearchWidget::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = doSearchUp;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_50,ppvVar1,(QObject *)&local_90,(void **)this,(QSlotObjectBase *)&local_a0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  ppvVar1 = *(void ***)(*(long *)(this + 0x28) + 0x40);
  local_90 = (QArrayData *)QAbstractButton::toggled;
  local_88 = (char16_t *)0x0;
  local_a0 = setReplaceMode;
  local_98 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QSlotObject<void_(QPlainTextEditSearchWidget::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar3 + 4) = setReplaceMode;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_58,ppvVar1,(QObject *)&local_90,(void **)this,(QSlotObjectBase *)&local_a0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  ppvVar1 = *(void ***)(*(long *)(this + 0x28) + 0x80);
  local_90 = (QArrayData *)QAbstractButton::clicked;
  local_88 = (char16_t *)0x0;
  local_a0 = doReplace;
  local_98 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QSlotObject<bool_(QPlainTextEditSearchWidget::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar3 + 4) = doReplace;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_60,ppvVar1,(QObject *)&local_90,(void **)this,(QSlotObjectBase *)&local_a0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  ppvVar1 = *(void ***)(*(long *)(this + 0x28) + 0x88);
  local_90 = (QArrayData *)QAbstractButton::clicked;
  local_88 = (char16_t *)0x0;
  local_a0 = doReplaceAll;
  local_98 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QPlainTextEditSearchWidget::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = doReplaceAll;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_68,ppvVar1,(QObject *)&local_90,(void **)this,(QSlotObjectBase *)&local_a0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  local_90 = (QArrayData *)QTimer::timeout;
  local_88 = (char16_t *)0x0;
  local_a0 = performSearch;
  local_98 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QPlainTextEditSearchWidget::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = performSearch;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)local_78,(QObject *)&local_90,(void **)this,
             (QSlotObjectBase *)&local_a0,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QObject::installEventFilter((QObject *)this);
  QObject::installEventFilter(*(QObject **)(*(long *)(this + 0x28) + 8));
  QObject::installEventFilter(*(QObject **)(*(long *)(this + 0x28) + 0x10));
  return;
}

Assistant:

QPlainTextEditSearchWidget::QPlainTextEditSearchWidget(QPlainTextEdit *parent)
    : QWidget(parent),
      ui(new Ui::QPlainTextEditSearchWidget),
      selectionColor(0, 180, 0, 100) {
    ui->setupUi(this);
    _textEdit = parent;
    _darkMode = false;
    hide();
    ui->searchCountLabel->setStyleSheet(QStringLiteral("* {color: grey}"));
    // hiding will leave a open space in the horizontal layout
    ui->searchCountLabel->setEnabled(false);
    _currentSearchResult = 0;
    _searchResultCount = 0;

    connect(ui->closeButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::deactivate);
    connect(ui->searchLineEdit, &QLineEdit::textChanged, this,
            &QPlainTextEditSearchWidget::searchLineEditTextChanged);
    connect(ui->searchDownButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doSearchDown);
    connect(ui->searchUpButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doSearchUp);
    connect(ui->replaceToggleButton, &QPushButton::toggled, this,
            &QPlainTextEditSearchWidget::setReplaceMode);
    connect(ui->replaceButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doReplace);
    connect(ui->replaceAllButton, &QPushButton::clicked, this,
            &QPlainTextEditSearchWidget::doReplaceAll);

    connect(&_debounceTimer, &QTimer::timeout,
            this, &QPlainTextEditSearchWidget::performSearch);

    installEventFilter(this);
    ui->searchLineEdit->installEventFilter(this);
    ui->replaceLineEdit->installEventFilter(this);

#ifdef Q_OS_MAC
    // set the spacing to 8 for OS X
    layout()->setSpacing(8);
    ui->buttonFrame->layout()->setSpacing(9);

    // set the margin to 0 for the top buttons for OS X
    QString buttonStyle = QStringLiteral("QPushButton {margin: 0}");
    ui->closeButton->setStyleSheet(buttonStyle);
    ui->searchDownButton->setStyleSheet(buttonStyle);
    ui->searchUpButton->setStyleSheet(buttonStyle);
    ui->replaceToggleButton->setStyleSheet(buttonStyle);
    ui->matchCaseSensitiveButton->setStyleSheet(buttonStyle);
#endif
}